

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageLayout.cpp
# Opt level: O1

void __thiscall KDReports::Test::testPageBreak(Test *this)

{
  char cVar1;
  int iVar2;
  longlong __tmp;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  Report report;
  Report local_80 [24];
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  char *local_20;
  QByteArrayView local_18;
  
  KDReports::Report::Report(local_80,(QObject *)0x0);
  local_20 = "First page";
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_18,&local_20);
  QVar3.m_data = (storage_type *)local_18.m_size;
  QVar3.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar3);
  local_50.d._0_4_ = 0;
  local_50.d._4_2_ = 0;
  local_50.d._6_2_ = 0;
  local_50.ptr._0_6_ = 0;
  local_50.ptr._6_2_ = 0;
  local_38.size = local_50.size;
  local_50.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  KDReports::TextElement::TextElement((TextElement *)&local_68,(QString *)&local_38);
  local_50.d._0_4_ = 0;
  local_50.d._4_2_ = 0xffff;
  local_50.d._6_2_ = 0;
  local_50.ptr._0_6_ = 0;
  KDReports::Report::addElement(local_80,&local_68,1);
  KDReports::TextElement::~TextElement((TextElement *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  KDReports::Report::addPageBreak();
  local_20 = "Second page";
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_18,&local_20);
  QVar4.m_data = (storage_type *)local_18.m_size;
  QVar4.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar4);
  local_38.d._0_4_ = local_50.d._0_4_;
  local_38.d._4_2_ = local_50.d._4_2_;
  local_38.d._6_2_ = local_50.d._6_2_;
  local_38.ptr._0_6_ = local_50.ptr._0_6_;
  local_38.ptr._6_2_ = local_50.ptr._6_2_;
  local_50.d._0_4_ = 0;
  local_50.d._4_2_ = 0;
  local_50.d._6_2_ = 0;
  local_50.ptr._0_6_ = 0;
  local_50.ptr._6_2_ = 0;
  local_38.size = local_50.size;
  local_50.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  KDReports::TextElement::TextElement((TextElement *)&local_68,(QString *)&local_38);
  local_50.d._0_4_ = 0;
  local_50.d._4_2_ = 0xffff;
  local_50.d._6_2_ = 0;
  local_50.ptr._0_6_ = 0;
  KDReports::Report::addElement(local_80,&local_68,1);
  KDReports::TextElement::~TextElement((TextElement *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  iVar2 = KDReports::Report::numberOfPages();
  cVar1 = QTest::qCompare(iVar2,2,"report.numberOfPages()","2",
                          "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                          ,0x2f);
  if (cVar1 != '\0') {
    KDReports::Report::addPageBreak();
    iVar2 = KDReports::Report::numberOfPages();
    cVar1 = QTest::qCompare(iVar2,3,"report.numberOfPages()","3",
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                            ,0x31);
    if (cVar1 != '\0') {
      KDReports::Report::addPageBreak();
      iVar2 = KDReports::Report::numberOfPages();
      cVar1 = QTest::qCompare(iVar2,3,"report.numberOfPages()","3",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                              ,0x33);
      if (cVar1 != '\0') {
        local_68.d = (Data *)0x0;
        local_68.ptr = (char16_t *)0x0;
        local_68.size = 0;
        KDReports::TextElement::TextElement((TextElement *)&local_50,(QString *)&local_68);
        local_38.d._0_4_ = 0;
        local_38.d._4_2_ = 0xffff;
        local_38.d._6_2_ = 0;
        local_38.ptr._0_6_ = 0;
        KDReports::Report::addElement(local_80,&local_50,1);
        KDReports::TextElement::~TextElement((TextElement *)&local_50);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        KDReports::Report::addPageBreak();
        iVar2 = KDReports::Report::numberOfPages();
        QTest::qCompare(iVar2,4,"report.numberOfPages()","4",
                        "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                        ,0x36);
      }
    }
  }
  KDReports::Report::~Report(local_80);
  return;
}

Assistant:

void testPageBreak()
    {
        Report report;
        report.addElement(KDReports::TextElement("First page"));
        report.addPageBreak();
        report.addElement(KDReports::TextElement("Second page"));
        QCOMPARE(report.numberOfPages(), 2);
        report.addPageBreak();
        QCOMPARE(report.numberOfPages(), 3);
        report.addPageBreak();
        QCOMPARE(report.numberOfPages(), 3); // yep, it's a flag, can only be set once; documented.
        report.addElement(KDReports::TextElement(QString()));
        report.addPageBreak();
        QCOMPARE(report.numberOfPages(), 4);
    }